

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O2

void __thiscall
irr::scene::CMeshSceneNode::CMeshSceneNode
          (CMeshSceneNode *this,IMesh *mesh,ISceneNode *parent,ISceneManager *mgr,s32 id,
          vector3df *position,vector3df *rotation,vector3df *scale)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__IReferenceCounted_0027ba48;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(undefined4 *)&this->field_0x1f0 = 1;
  IMeshSceneNode::IMeshSceneNode
            ((IMeshSceneNode *)this,&PTR_construction_vtable_24__0027c3e0,parent,mgr,id,position,
             rotation,scale);
  *(undefined8 *)this = 0x27c270;
  *(undefined8 *)&this->field_0x1e0 = 0x27c3c8;
  (this->Materials).m_data.
  super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Materials).m_data.
  super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Materials).m_data.
  super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Materials).is_sorted = true;
  (this->Box).MinEdge.X = -1.0;
  (this->Box).MinEdge.Y = -1.0;
  *(undefined8 *)&(this->Box).MinEdge.Z = 0x3f800000bf800000;
  (this->Box).MaxEdge.Y = 1.0;
  (this->Box).MaxEdge.Z = 1.0;
  video::SMaterial::SMaterial(&this->ReadOnlyMaterial);
  this->Mesh = (IMesh *)0x0;
  this->PassCount = 0;
  this->ReadOnlyMaterials = false;
  (**(code **)(*(long *)this + 0x120))(this,mesh);
  return;
}

Assistant:

CMeshSceneNode::CMeshSceneNode(IMesh *mesh, ISceneNode *parent, ISceneManager *mgr, s32 id,
		const core::vector3df &position, const core::vector3df &rotation,
		const core::vector3df &scale) :
		IMeshSceneNode(parent, mgr, id, position, rotation, scale),
		Mesh(0),
		PassCount(0), ReadOnlyMaterials(false)
{
#ifdef _DEBUG
	setDebugName("CMeshSceneNode");
#endif

	setMesh(mesh);
}